

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGridWrapC.cpp
# Opt level: O2

void tsgSetLocalSurplusRefinement
               (void *grid,double tolerance,char *sRefinementType,int output,int *level_limits,
               double *scale_correction)

{
  TypeRefinement criteria;
  ostream *poVar1;
  allocator<char> local_59;
  double local_58;
  string local_50;
  
  local_58 = tolerance;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,sRefinementType,&local_59);
  criteria = TasGrid::IO::getTypeRefinementString(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (criteria == refine_none) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"WARNING: incorrect refinement type: ");
    poVar1 = std::operator<<(poVar1,sRefinementType);
    poVar1 = std::operator<<(poVar1,", defaulting to type_classic.");
    std::endl<char,std::char_traits<char>>(poVar1);
    criteria = refine_classic;
  }
  TasGrid::TasmanianSparseGrid::setSurplusRefinement
            ((TasmanianSparseGrid *)grid,local_58,criteria,output,level_limits,scale_correction);
  return;
}

Assistant:

void tsgSetLocalSurplusRefinement(void *grid, double tolerance, const char * sRefinementType, int output, const int *level_limits, const double *scale_correction){
    TypeRefinement ref_type = IO::getTypeRefinementString(sRefinementType);
    #ifndef NDEBUG
    if (ref_type == refine_none){ cerr << "WARNING: incorrect refinement type: " << sRefinementType << ", defaulting to type_classic." << endl; }
    #endif // NDEBUG
    if (ref_type == refine_none){ ref_type = refine_classic; }
    ((TasmanianSparseGrid*) grid)->setSurplusRefinement(tolerance, ref_type, output, level_limits, scale_correction);
}